

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_path_equal(mg_path *lhs,mg_path *rhs)

{
  long *plVar1;
  long *plVar2;
  uint uVar3;
  mg_node **ppmVar4;
  mg_node **ppmVar5;
  mg_unbound_relationship **ppmVar6;
  mg_unbound_relationship **ppmVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  uVar12 = (ulong)lhs->node_count;
  uVar9 = 0;
  if (((lhs->node_count == rhs->node_count) &&
      (uVar10 = (ulong)lhs->relationship_count, uVar9 = 0,
      lhs->relationship_count == rhs->relationship_count)) &&
     (uVar3 = lhs->sequence_length, uVar3 == rhs->sequence_length)) {
    bVar14 = uVar12 != 0;
    if (bVar14) {
      ppmVar4 = lhs->nodes;
      ppmVar5 = rhs->nodes;
      iVar8 = mg_node_equal(*ppmVar4,*ppmVar5);
      if (iVar8 != 0) {
        uVar11 = 0;
        do {
          if (uVar12 - 1 == uVar11) goto LAB_0010b865;
          iVar8 = mg_node_equal(ppmVar4[uVar11 + 1],ppmVar5[uVar11 + 1]);
          uVar11 = uVar11 + 1;
        } while (iVar8 != 0);
        bVar14 = uVar11 < uVar12;
      }
      if (bVar14) {
        return 0;
      }
    }
LAB_0010b865:
    bVar14 = uVar10 != 0;
    if (bVar14) {
      ppmVar6 = lhs->relationships;
      ppmVar7 = rhs->relationships;
      iVar8 = mg_unbound_relationship_equal(*ppmVar6,*ppmVar7);
      if (iVar8 != 0) {
        uVar12 = 0;
        do {
          if (uVar10 - 1 == uVar12) goto LAB_0010b8bd;
          iVar8 = mg_unbound_relationship_equal(ppmVar6[uVar12 + 1],ppmVar7[uVar12 + 1]);
          uVar12 = uVar12 + 1;
        } while (iVar8 != 0);
        bVar14 = uVar12 < uVar10;
      }
      if (bVar14) {
        return 0;
      }
    }
LAB_0010b8bd:
    bVar14 = uVar3 == 0;
    if (!bVar14) {
      if (*lhs->sequence == *rhs->sequence) {
        lVar13 = 1;
        do {
          uVar9 = (uint)lVar13;
          if (uVar3 == uVar9) break;
          plVar1 = lhs->sequence + lVar13;
          plVar2 = rhs->sequence + lVar13;
          lVar13 = lVar13 + 1;
        } while (*plVar1 == *plVar2);
        bVar14 = uVar3 <= uVar9;
      }
    }
    uVar9 = (uint)bVar14;
  }
  return uVar9;
}

Assistant:

int mg_path_equal(const mg_path *lhs, const mg_path *rhs) {
  if (lhs->node_count != rhs->node_count ||
      lhs->relationship_count != rhs->relationship_count ||
      lhs->sequence_length != rhs->sequence_length) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->node_count; ++i) {
    if (!mg_node_equal(lhs->nodes[i], rhs->nodes[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->relationship_count; ++i) {
    if (!mg_unbound_relationship_equal(lhs->relationships[i],
                                       rhs->relationships[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->sequence_length; ++i) {
    if (lhs->sequence[i] != rhs->sequence[i]) {
      return 0;
    }
  }
  return 1;
}